

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

bool ImGui::SFML::Init(RenderWindow *window,bool loadDefaultFont)

{
  bool bVar1;
  uint uVar2;
  uint extraout_var;
  Vector2f local_18;
  
  uVar2 = (*(window->super_RenderTarget)._vptr_RenderTarget[2])(&window->super_RenderTarget);
  local_18.y = (float)extraout_var;
  local_18.x = (float)uVar2;
  bVar1 = Init(&window->super_Window,&local_18,loadDefaultFont);
  return bVar1;
}

Assistant:

bool Init(sf::RenderWindow& window, bool loadDefaultFont) {
    return Init(window, window, loadDefaultFont);
}